

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::createExpansionLoc
          (SourceManager *this,SourceLocation originalLoc,SourceRange expansionRange,bool isMacroArg
          )

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> name;
  BufferID local_a8 [4];
  SourceLocation local_98;
  SourceLocation SStack_90;
  SourceLocation local_80;
  ExpansionInfo local_78;
  undefined1 local_48 [8];
  unique_lock<std::shared_mutex> lock;
  bool isMacroArg_local;
  SourceManager *this_local;
  SourceRange expansionRange_local;
  SourceLocation originalLoc_local;
  
  lock._15_1_ = isMacroArg;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)local_48,&this->mut);
  local_98 = expansionRange.startLoc;
  SStack_90 = expansionRange.endLoc;
  local_80 = originalLoc;
  ExpansionInfo::ExpansionInfo(&local_78,originalLoc,expansionRange,(bool)(lock._15_1_ & 1));
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::emplace_back<slang::SourceManager::ExpansionInfo>(&this->bufferEntries,&local_78);
  sVar1 = std::
          vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
          ::size(&this->bufferEntries);
  name = sv("",0);
  BufferID::BufferID(local_a8,(int)sVar1 - 1,name);
  SourceLocation::SourceLocation(&originalLoc_local,local_a8[0],0);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_48);
  return originalLoc_local;
}

Assistant:

SourceLocation SourceManager::createExpansionLoc(SourceLocation originalLoc,
                                                 SourceRange expansionRange, bool isMacroArg) {
    std::unique_lock lock(mut);

    bufferEntries.emplace_back(ExpansionInfo(originalLoc, expansionRange, isMacroArg));
    return SourceLocation(BufferID((uint32_t)(bufferEntries.size() - 1), ""sv), 0);
}